

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O2

void benchmark::AppendHumanReadable(int n,string *str)

{
  ostream *poVar1;
  int precision;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"/");
  ToBinaryStringFullySpecified_abi_cxx11_(&local_1c0,(benchmark *)0x0,(double)n,1.0,precision);
  std::operator<<(poVar1,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)str);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void AppendHumanReadable(int n, std::string* str) {
  std::stringstream ss;
  // Round down to the nearest SI prefix.
  ss << "/" << ToBinaryStringFullySpecified(n, 1.0, 0);
  *str += ss.str();
}